

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearDepth::initializeRbo
          (ModifyRenderbufferClearDepth *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl;
  GLenum GVar1;
  
  gl = api->m_gl;
  framebufferRenderbuffer(gl,0x8d00,renderbuffer);
  (*gl->viewport)(0,0,reference->m_width,reference->m_height);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x346);
  (*gl->clearDepthf)(this->m_depth);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clearDepthf(m_depth)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x347);
  (*gl->clear)(0x100);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clear(GL_DEPTH_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x348);
  tcu::clearDepth((reference->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start,this->m_depth);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearDepth::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_DEPTH_ATTACHMENT, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearDepthf(m_depth));
	GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));

	tcu::clearDepth(reference.getLevel(0), m_depth);
}